

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O0

void __thiscall CTcLibParser::scan_var(CTcLibParser *this,char *name,char *val)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  char *in_stack_ffffffffffffffd8;
  
  iVar1 = stricmp((char *)in_RDI,in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    (**(code **)(*in_RDI + 0x60))(in_RDI,in_RDX);
  }
  else {
    iVar1 = stricmp((char *)in_RDI,in_stack_ffffffffffffffd8);
    if (iVar1 == 0) {
      (**(code **)(*in_RDI + 0x88))(in_RDI,in_RDX);
    }
    else {
      iVar1 = stricmp((char *)in_RDI,in_stack_ffffffffffffffd8);
      if (iVar1 == 0) {
        (**(code **)(*in_RDI + 0x90))(in_RDI,in_RDX);
      }
      else {
        iVar1 = stricmp((char *)in_RDI,in_stack_ffffffffffffffd8);
        if (iVar1 == 0) {
          (**(code **)(*in_RDI + 0x98))(in_RDI,in_RDX);
        }
        else {
          iVar1 = stricmp((char *)in_RDI,in_stack_ffffffffffffffd8);
          if (iVar1 == 0) {
            (**(code **)(*in_RDI + 0xa0))(in_RDI,in_RDX);
          }
          else {
            (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI,in_RDX);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CTcLibParser::scan_var(const char *name, const char *val)
{
    /* call the appropriate routine based on the variable name */
    if (stricmp(name, "name") == 0)
        scan_name(val);
    else if (stricmp(name, "source") == 0)
        scan_source(val);
    else if (stricmp(name, "library") == 0)
        scan_library(val);
    else if (stricmp(name, "resource") == 0)
        scan_resource(val);
    else if (stricmp(name, "needmacro") == 0)
        scan_needmacro(val);
    else
        err_unknown_var(name, val);
}